

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void * ma_malloc(size_t sz,ma_allocation_callbacks *pAllocationCallbacks)

{
  undefined8 *in_RSI;
  size_t in_RDI;
  void *local_8;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_8 = ma__malloc_default(in_RDI,(void *)0x0);
  }
  else if (in_RSI[1] == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)(*(code *)in_RSI[1])(in_RDI,*in_RSI);
  }
  return local_8;
}

Assistant:

MA_API void* ma_malloc(size_t sz, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks != NULL) {
        if (pAllocationCallbacks->onMalloc != NULL) {
            return pAllocationCallbacks->onMalloc(sz, pAllocationCallbacks->pUserData);
        } else {
            return NULL;    /* Do not fall back to the default implementation. */
        }
    } else {
        return ma__malloc_default(sz, NULL);
    }
}